

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall chrono::ChSystemDescriptor::CountActiveVariables(ChSystemDescriptor *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChVariables *pCVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (this->freeze_count == true) {
    iVar4 = this->n_q;
  }
  else {
    ppCVar1 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar2 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    this->n_q = 0;
    lVar5 = (long)ppCVar2 - (long)ppCVar1;
    if (lVar5 == 0) {
      iVar4 = 0;
    }
    else {
      lVar5 = lVar5 >> 3;
      iVar4 = 0;
      lVar6 = 0;
      do {
        pCVar3 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar6];
        if (pCVar3->disabled == false) {
          pCVar3->offset = iVar4;
          iVar4 = (*pCVar3->_vptr_ChVariables[2])();
          iVar4 = iVar4 + this->n_q;
          this->n_q = iVar4;
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
  }
  return iVar4;
}

Assistant:

int ChSystemDescriptor::CountActiveVariables() {
    if (freeze_count)  // optimization, avoid list count all times
        return n_q;
    
    auto vv_size = vvariables.size();

    n_q = 0;
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->SetOffset(n_q);  // also store offsets in state and MC matrix
            n_q += vvariables[iv]->Get_ndof();
        }
    }
    return n_q;
}